

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall
restincurl::Request::AddFileAsMimeData
          (Request *this,string *path,string *name,string *remoteName,string *mimeType)

{
  curl_mime *pcVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  pcVar1 = this->mime_;
  if (pcVar1 == (curl_mime *)0x0) {
    pcVar1 = (curl_mime *)
             curl_mime_init(((this->eh_)._M_t.
                             super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
                             .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->
                            handle_);
    this->mime_ = pcVar1;
    if (pcVar1 == (curl_mime *)0x0) {
      __assert_fail("mime_",
                    "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                    ,0x21b,
                    "void restincurl::Request::AddFileAsMimeData(const std::string &, const std::string &, const std::string &, const std::string &)"
                   );
    }
  }
  uVar2 = curl_mime_addpart(pcVar1);
  curl_mime_filedata(uVar2,(path->_M_dataplus)._M_p);
  if (name->_M_string_length == 0) {
    pcVar3 = "file";
  }
  else {
    pcVar3 = (name->_M_dataplus)._M_p;
  }
  curl_mime_name(uVar2,pcVar3);
  if (remoteName->_M_string_length != 0) {
    curl_mime_filename(uVar2,(remoteName->_M_dataplus)._M_p);
  }
  if (mimeType->_M_string_length != 0) {
    curl_mime_type(uVar2,(mimeType->_M_dataplus)._M_p);
    return;
  }
  return;
}

Assistant:

void AddFileAsMimeData(const std::string& path,
                               const std::string& name,
                               const std::string& remoteName,
                               const std::string& mimeType) {

            InitMime();
            assert(mime_);
            auto * part = curl_mime_addpart(mime_);
            curl_mime_filedata(part, path.c_str());
            curl_mime_name(part, name.empty() ? "file" :name.c_str());

            if (!remoteName.empty()) {
                curl_mime_filename(part, remoteName.c_str());
            }

            if (!mimeType.empty()) {
                curl_mime_type(part, mimeType.c_str());
            }
        }